

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O1

Gia_ManEra_t * Gia_ManEraCreate(Gia_Man_t *pAig)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  Gia_ManEra_t *pGVar4;
  uint *__s;
  Mem_Fixed_t *pMVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  uint *puVar8;
  undefined8 *__ptr;
  void *pvVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  byte bVar13;
  byte bVar14;
  undefined8 *puVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  
  pGVar4 = (Gia_ManEra_t *)calloc(1,0x58);
  pGVar4->pAig = pAig;
  uVar17 = pAig->nRegs;
  iVar18 = pAig->vCis->nSize - uVar17;
  bVar13 = (char)iVar18 - 5;
  iVar19 = 1 << (bVar13 & 0x1f);
  iVar16 = (((int)uVar17 >> 5) + 1) - (uint)((uVar17 & 0x1f) == 0);
  if (iVar18 < 6) {
    iVar19 = 1;
  }
  pGVar4->nWordsSim = iVar19;
  pGVar4->nWordsDat = iVar16;
  bVar14 = bVar13;
  if (iVar18 < 6) {
    bVar14 = 0;
  }
  __s = (uint *)malloc((long)(pAig->nObjs << (bVar14 & 0x1f)) << 2);
  pGVar4->pDataSim = __s;
  pMVar5 = Mem_FixedStart(iVar16 * 4 + 0x10);
  pGVar4->pMemory = pMVar5;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800000);
  pVVar6->pArray = ppvVar7;
  pGVar4->vStates = pVVar6;
  uVar17 = 99999;
  while( true ) {
    do {
      uVar1 = uVar17 + 1;
      uVar3 = uVar17 & 1;
      uVar17 = uVar1;
    } while (uVar3 != 0);
    if (uVar1 < 9) break;
    iVar16 = 5;
    while (uVar1 % (iVar16 - 2U) != 0) {
      uVar3 = iVar16 * iVar16;
      iVar16 = iVar16 + 2;
      if (uVar1 < uVar3) goto LAB_0072807a;
    }
  }
LAB_0072807a:
  pGVar4->nBins = uVar1;
  puVar8 = (uint *)calloc((long)(int)uVar1,4);
  pGVar4->pBins = puVar8;
  pVVar6->nSize = 1;
  *pVVar6->pArray = (void *)0x0;
  uVar22 = (long)pAig->vCis->nSize - (long)pAig->nRegs;
  uVar17 = 1 << ((char)uVar22 - 5U & 0x1f);
  iVar16 = (int)uVar22;
  if (iVar16 < 6) {
    uVar17 = 1;
  }
  __ptr = (undefined8 *)malloc(((long)(int)uVar17 * 4 + 8) * uVar22);
  uVar21 = uVar22 & 0xffffffff;
  if (0 < iVar16) {
    pvVar9 = __ptr + uVar22;
    puVar15 = __ptr;
    uVar22 = uVar21;
    do {
      *puVar15 = pvVar9;
      puVar15 = puVar15 + 1;
      pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar17 * 4);
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
    if (0 < iVar16) {
      uVar22 = 0;
      do {
        lVar10 = __ptr[uVar22];
        if (uVar22 < 5) {
          if (0 < (int)uVar17) {
            uVar2 = (&DAT_00a273d0)[uVar22];
            uVar20 = 0;
            do {
              *(undefined4 *)(lVar10 + uVar20 * 4) = uVar2;
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
          }
        }
        else if (0 < (int)uVar17) {
          uVar20 = 0;
          do {
            *(uint *)(lVar10 + uVar20 * 4) =
                 -(uint)((1 << ((char)uVar22 - 5U & 0x1f) & (uint)uVar20) != 0);
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar21);
    }
  }
  if (0 < iVar16) {
    uVar22 = 0;
    pVVar11 = pAig->vCis;
    iVar16 = pAig->nRegs;
    if (iVar18 < 6) {
      bVar13 = 0;
    }
    do {
      lVar10 = (long)pVVar11->nSize;
      if (lVar10 - iVar16 <= (long)uVar22) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (lVar10 <= (long)uVar22) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar18 = pVVar11->pArray[uVar22];
      if ((iVar18 < 0) || (pAig->nObjs <= iVar18)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      memcpy(__s + (iVar18 << (bVar13 & 0x1f)),(void *)__ptr[uVar22],(long)iVar19 * 4);
      uVar22 = uVar22 + 1;
    } while (uVar21 != uVar22);
  }
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  memset(__s,0,(long)iVar19 << 2);
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 1000;
  pVVar11->nSize = 0;
  piVar12 = (int *)malloc(4000);
  pVVar11->pArray = piVar12;
  pGVar4->vStgDump = pVVar11;
  return pGVar4;
}

Assistant:

Gia_ManEra_t * Gia_ManEraCreate( Gia_Man_t * pAig )
{
    Vec_Ptr_t * vTruths;
    Gia_ManEra_t * p;
    unsigned * pTruth, * pSimInfo;
    int i;
    p = ABC_CALLOC( Gia_ManEra_t, 1 );
    p->pAig      = pAig;
    p->nWordsSim = Abc_TruthWordNum( Gia_ManPiNum(pAig) );
    p->nWordsDat = Abc_BitWordNum( Gia_ManRegNum(pAig) );
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWordsSim*Gia_ManObjNum(pAig) );
    p->pMemory   = Mem_FixedStart( sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat );
    p->vStates   = Vec_PtrAlloc( 100000 );
    p->nBins     = Abc_PrimeCudd( 100000 );
    p->pBins     = ABC_CALLOC( unsigned, p->nBins );
    Vec_PtrPush( p->vStates, NULL );
    // assign primary input values
    vTruths = Vec_PtrAllocTruthTables( Gia_ManPiNum(pAig) );
    Vec_PtrForEachEntry( unsigned *, vTruths, pTruth, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(pAig, Gia_ManPi(pAig, i)) );
        memcpy( pSimInfo, pTruth, sizeof(unsigned) * p->nWordsSim );
    }
    Vec_PtrFree( vTruths );
    // assign constant zero node
    pSimInfo = Gia_ManEraData( p, 0 );
    memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    p->vStgDump = Vec_IntAlloc( 1000 );
    return p;
}